

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bms_header_table.cpp
# Opt level: O2

bool __thiscall BmsHeaderTable::Query(BmsHeaderTable *this,string *key,string *v)

{
  bool bVar1;
  string *psVar2;
  string local_40 [32];
  
  bVar1 = IsExists(this,key);
  if (bVar1) {
    psVar2 = (string *)operator[](this,key);
    std::__cxx11::string::string(local_40,psVar2);
    std::__cxx11::string::operator=((string *)v,local_40);
    std::__cxx11::string::~string(local_40);
  }
  return bVar1;
}

Assistant:

bool
BmsHeaderTable::Query(const std::string& key, std::string& v)
{
	if (IsExists(key)) {
		v = this->operator[](key).ToString();
		return true;
	}
	return false;
}